

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void api_suite::api_emplace_hint(void)

{
  map_array<int,_int,_4UL,_std::less<int>_> array;
  iterator local_80;
  int local_78 [2];
  map_array<int,int,4ul,std::less<int>> *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  map_array<int,int,4ul,std::less<int>> *local_48;
  map_array<int,int,4ul,std::less<int>> **local_40;
  map_array<int,int,4ul,std::less<int>> *local_38;
  
  local_40 = &local_48;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_80 = (iterator)0x0;
  local_70 = (map_array<int,int,4ul,std::less<int>> *)((ulong)local_70 & 0xffffffff00000000);
  local_48 = (map_array<int,int,4ul,std::less<int>> *)&local_68;
  local_38 = (map_array<int,int,4ul,std::less<int>> *)&local_68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x69,"void api_suite::api_emplace_hint()",&local_80,&local_70);
  local_78[1] = 0xb;
  local_78[0] = 1;
  local_80 = vista::map_array<int,int,4ul,std::less<int>>::emplace<int,int>
                       ((map_array<int,int,4ul,std::less<int>> *)&local_68,local_78 + 1,local_78);
  local_70 = local_48;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.emplace_hint(array.begin(), 11, 1)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x6a,"void api_suite::api_emplace_hint()",&local_80,&local_70);
  local_80 = (iterator)((long)local_38 - (long)local_48 >> 3);
  local_70 = (map_array<int,int,4ul,std::less<int>> *)CONCAT44(local_70._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x6b,"void api_suite::api_emplace_hint()",&local_80,&local_70);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}